

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

bool UTF_uc16_to_uc32(UTF_UC16 *uc16,UTF_UC32 *uc32)

{
  UTF_UC16 UVar1;
  UTF_UC16 UVar2;
  UTF_UC32 UVar3;
  
  UVar1 = *uc16;
  UVar3 = (UTF_UC32)(ushort)UVar1;
  if ((UVar1 & 0xfc00U) == 0xdc00) {
    UVar2 = uc16[1];
  }
  else {
    if ((UVar1 & 0xfc00U) != 0xd800) goto LAB_00103381;
    UVar2 = uc16[1];
    if ((UVar2 & 0xfc00U) == 0xdc00) {
      UVar3 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + L'\xfca02400';
      goto LAB_00103381;
    }
  }
  if (UVar2 != L'\0') {
    return false;
  }
LAB_00103381:
  *uc32 = UVar3;
  return true;
}

Assistant:

static __inline bool
UTF_uc16_to_uc32(const UTF_UC16 uc16[4], UTF_UC32 *uc32)
{
    if (UTF_uc16_is_surrogate_high(uc16[0]))
    {
        if (UTF_uc16_is_surrogate_low(uc16[1]))
        {
            *uc32 = 0x10000 + (UTF_STATIC_CAST(UTF_UC32, uc16[0]) - 0xD800) * 0x400 +
                    (UTF_STATIC_CAST(UTF_UC32, uc16[1]) - 0xDC00);
            return true;
        }
        else if (uc16[1] == 0)
        {
            *uc32 = uc16[0];
            return true;
        }
        return false;
    }
    else if (UTF_uc16_is_surrogate_low(uc16[0]))
    {
        if (uc16[1] != 0)
            return false;

        *uc32 = uc16[0];
        return true;
    }
    else
    {
        *uc32 = uc16[0];
        return true;
    }
}